

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFields
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (0 < *(int *)(desc + 0x2c)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      if ((*(char *)(*(long *)(desc + 0x30) + 0x50 + lVar2) != '\x01') ||
         (iVar1 = std::__cxx11::string::compare
                            ((char *)**(undefined8 **)
                                       (*(long *)(*(long *)(desc + 0x30) + 0x58 + lVar2) + 0x10)),
         iVar1 != 0)) {
        GenerateClassField(this,options,printer,(FieldDescriptor *)(*(long *)(desc + 0x30) + lVar2))
        ;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(desc + 0x2c));
  }
  return;
}

Assistant:

void Generator::GenerateClassFields(const GeneratorOptions& options,
                                    io::Printer* printer,
                                    const Descriptor* desc) const {
  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassField(options, printer, desc->field(i));
    }
  }
}